

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

bool __thiscall optimization::common_expr_del::BlockNodes::exportNode(BlockNodes *this,uint32_t idx)

{
  bool bVar1;
  size_type sVar2;
  iterator __k;
  mapped_type_conflict *pmVar3;
  uint in_ESI;
  map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  *in_RDI;
  NodeId nodeId;
  iterator __end2;
  iterator __begin2;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  *__range2;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  parents;
  bool flag;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  *in_stack_ffffffffffffff68;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  *in_stack_ffffffffffffff70;
  key_type_conflict *in_stack_ffffffffffffff78;
  _Self local_60;
  map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  *this_00;
  map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  local_48;
  byte local_15;
  uint local_14;
  byte local_1;
  
  local_14 = in_ESI;
  sVar2 = std::
          map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
          ::count(in_RDI,in_stack_ffffffffffffff78);
  if (sVar2 == 0) {
    local_15 = 0;
    std::
    vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
    ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,(ulong)local_14);
    std::
    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x179d91);
    std::
    set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
    ::set(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = &local_48;
    __k = std::
          set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
          ::begin(in_stack_ffffffffffffff68);
    local_60._M_node =
         (_Base_ptr)
         std::
         set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
         ::end(in_stack_ffffffffffffff68);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa8,&local_60), bVar1) {
      std::_Rb_tree_const_iterator<optimization::common_expr_del::NodeId>::operator*
                ((_Rb_tree_const_iterator<optimization::common_expr_del::NodeId> *)0x179dec);
      in_stack_ffffffffffffff78 =
           (key_type_conflict *)
           std::
           map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
           ::count(in_RDI,in_stack_ffffffffffffff78);
      if (in_stack_ffffffffffffff78 == (key_type_conflict *)0x0) {
        local_15 = 1;
      }
      std::_Rb_tree_const_iterator<optimization::common_expr_del::NodeId>::operator++
                ((_Rb_tree_const_iterator<optimization::common_expr_del::NodeId> *)
                 in_stack_ffffffffffffff70);
    }
    bVar1 = (local_15 & 1) == 0;
    if (bVar1) {
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                 in_stack_ffffffffffffff78);
      pmVar3 = std::
               map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](this_00,&(__k._M_node)->_M_color);
      *pmVar3 = true;
    }
    local_1 = bVar1;
    std::
    set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
    ::~set((set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
            *)0x179ecb);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool exportNode(uint32_t idx) {
    if (added.count(idx)) {
      return false;
    }
    bool flag = false;
    auto parents = nodes[idx]->parents;
    for (auto nodeId : parents) {
      if (!added.count(nodeId.id)) {
        flag = true;
      }
    }
    if (flag) {
      return false;
    }
    exportQueue.push_back(idx);
    added[idx] = true;
    // for (auto operand : nodes[idx]->operands) {
    //   if (operand.index() == 1) {
    //     auto nodeId = std::get<NodeId>(operand);
    //     exportNode(nodeId.id);
    //     break;
    //   }
    // }
    return true;
  }